

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall
mp::NLFeeder_Easy::
FeedColumnSizes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::ColSizeWriter>
          (NLFeeder_Easy *this,ColSizeWriter *csw)

{
  long lVar1;
  
  if (1 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars) {
    lVar1 = 0;
    do {
      NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::ColSizeWriter::Write
                (csw,(this->col_sizes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [(this->var_perm_).
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar1].second]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < (long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars + -1);
  }
  return;
}

Assistant:

void FeedColumnSizes(ColSizeWriter& csw) {
    if (WantColumnSizes())
      for (int i=0; i < header_.num_vars-1; ++i)
        csw.Write(col_sizes_[VPermInv(i)]);
  }